

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void lm_trie_write_bin(lm_trie_t *trie,uint32 unigram_count,FILE *fp)

{
  long lVar1;
  FILE *fp_local;
  uint32 unigram_count_local;
  lm_trie_t *trie_local;
  
  if (trie->quant != (lm_trie_quant_t *)0x0) {
    lm_trie_quant_write_bin(trie->quant,fp);
  }
  lVar1 = ftell((FILE *)fp);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,0x1b9,"pos after quant: %ld\n",lVar1);
  lm_trie_write_ug(trie,unigram_count,fp);
  lVar1 = ftell((FILE *)fp);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
          ,0x1bb,"pos after ug: %ld\n",lVar1);
  if (trie->ngram_mem != (uint8 *)0x0) {
    fwrite(trie->ngram_mem,1,trie->ngram_mem_size,(FILE *)fp);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
            ,0x1be,"#ngram_mem: %ld\n",trie->ngram_mem_size);
  }
  return;
}

Assistant:

void
lm_trie_write_bin(lm_trie_t * trie, uint32 unigram_count, FILE * fp)
{

    if (trie->quant)
        lm_trie_quant_write_bin(trie->quant, fp);
    E_INFO("pos after quant: %ld\n", ftell(fp));
    lm_trie_write_ug(trie, unigram_count, fp);
    E_INFO("pos after ug: %ld\n", ftell(fp));
    if (trie->ngram_mem) {
        fwrite(trie->ngram_mem, 1, trie->ngram_mem_size, fp);
        E_INFO("#ngram_mem: %ld\n", trie->ngram_mem_size);
    }
}